

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::(anonymous_namespace)::QueueTest::Producer>::~ArrayBuilder
          (ArrayBuilder<kj::(anonymous_namespace)::QueueTest::Producer> *this)

{
  Producer *pPVar1;
  RemoveConst<kj::(anonymous_namespace)::QueueTest::Producer> *pRVar2;
  Producer *pPVar3;
  
  pPVar1 = this->ptr;
  if (pPVar1 != (Producer *)0x0) {
    pRVar2 = this->pos;
    pPVar3 = this->endPtr;
    this->ptr = (Producer *)0x0;
    this->pos = (RemoveConst<kj::(anonymous_namespace)::QueueTest::Producer> *)0x0;
    this->endPtr = (Producer *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pPVar1,0x10,(long)pRVar2 - (long)pPVar1 >> 4,
               (long)pPVar3 - (long)pPVar1 >> 4,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::QueueTest::Producer>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }